

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialogPrivate::pickScreenColor(QColorDialogPrivate *this)

{
  QWidget *this_00;
  char cVar1;
  long *plVar2;
  QWindow *pQVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  QColorPickingEventFilter *this_01;
  QColorDialogPrivate *this_02;
  long in_FS_OFFSET;
  QColor QVar6;
  QPoint local_50;
  QObject local_48 [8];
  code *local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  plVar2 = (long *)(**(code **)(*QGuiApplicationPrivate::platform_integration + 0x98))();
  if (plVar2 != (long *)0x0) {
    cVar1 = (**(code **)(*plVar2 + 0x28))(plVar2,0);
    if (cVar1 != '\0') {
      pQVar3 = QWidget::windowHandle(this_00);
      ppvVar4 = (void **)(**(code **)(*plVar2 + 0x30))(plVar2,pQVar3);
      if (ppvVar4 != (void **)0x0) {
        local_40 = QPlatformServiceColorPicker::colorPicked;
        local_38 = 0;
        puVar5 = (undefined4 *)operator_new(0x20);
        *puVar5 = 1;
        *(code **)(puVar5 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qcolordialog.cpp:1616:24),_QtPrivate::List<const_QColor_&>,_void>
             ::impl;
        *(QWidget **)(puVar5 + 4) = this_00;
        *(void ***)(puVar5 + 6) = ppvVar4;
        QObject::connectImpl
                  (local_48,ppvVar4,(QObject *)&local_40,(void **)this_00,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_48);
        (**(code **)((long)*ppvVar4 + 0x60))(ppvVar4);
        goto LAB_004d3e49;
      }
    }
  }
  if (this->colorPickingEventFilter == (QColorPickingEventFilter *)0x0) {
    this_01 = (QColorPickingEventFilter *)operator_new(0x18);
    QObject::QObject((QObject *)this_01,&this_00->super_QObject);
    *(undefined ***)this_01 = &PTR_metaObject_00800e38;
    this_01->m_dp = this;
    this->colorPickingEventFilter = this_01;
  }
  QObject::installEventFilter(&this_00->super_QObject);
  this->beforeScreenColorPicking = this->cs->curCol;
  QCursor::QCursor((QCursor *)&local_40,CrossCursor);
  QWidget::grabMouse(this_00,(QCursor *)&local_40);
  QCursor::~QCursor((QCursor *)&local_40);
  QWidget::grabKeyboard(this_00);
  QWidget::setAttribute(this_00,WA_MouseTracking,true);
  QWidget::setDisabled((QWidget *)this->addCusBt,true);
  QWidget::setDisabled(&this->buttons->super_QWidget,true);
  this_02 = (QColorDialogPrivate *)this->eyeDropperButton;
  if (this_02 != (QColorDialogPrivate *)0x0) {
    QWidget::setDisabled((QWidget *)this_02,true);
    local_50 = (QPoint)QCursor::pos();
    QVar6 = grabScreenColor(this_02,&local_50);
    local_40 = QVar6._0_8_;
    local_38._0_6_ = QVar6.ct._4_6_;
    setCurrentColor(*(QColorDialogPrivate **)&this_00->field_0x8,(QColor *)&local_40,SetColorAll);
    updateColorLabelText(this,&local_50);
  }
LAB_004d3e49:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::pickScreenColor()
{
    Q_Q(QColorDialog);

    auto *platformServices = QGuiApplicationPrivate::platformIntegration()->services();
    if (platformServices && platformServices->hasCapability(QPlatformServices::Capability::ColorPicking)) {
        if (auto *colorPicker = platformServices->colorPicker(q->windowHandle())) {
            q->connect(colorPicker, &QPlatformServiceColorPicker::colorPicked, q,
                       [q, colorPicker](const QColor &color) {
                           colorPicker->deleteLater();
                           q->setCurrentColor(color);
                       });
            colorPicker->pickColor();
            return;
        }
    }

    if (!colorPickingEventFilter)
        colorPickingEventFilter = new QColorPickingEventFilter(this, q);
    q->installEventFilter(colorPickingEventFilter);
    // If user pushes Escape, the last color before picking will be restored.
    beforeScreenColorPicking = cs->currentColor();
#ifndef QT_NO_CURSOR
    q->grabMouse(Qt::CrossCursor);
#else
    q->grabMouse();
#endif

#ifdef Q_OS_WIN32
    // On Windows mouse tracking doesn't work over other processes's windows
    updateTimer->start(30);

    // HACK: Because mouse grabbing doesn't work across processes, we have to have a dummy,
    // invisible window to catch the mouse click, otherwise we will click whatever we clicked
    // and loose focus.
    dummyTransparentWindow.show();
#endif
    q->grabKeyboard();
    /* With setMouseTracking(true) the desired color can be more precisely picked up,
     * and continuously pushing the mouse button is not necessary.
     */
    q->setMouseTracking(true);

    addCusBt->setDisabled(true);
    buttons->setDisabled(true);
    if (eyeDropperButton) {
        eyeDropperButton->setDisabled(true);
        const QPoint globalPos = QCursor::pos();
        q->setCurrentColor(grabScreenColor(globalPos));
        updateColorLabelText(globalPos);
    }
}